

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.h
# Opt level: O2

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addSupportedExtensionsToSet<spv_operand_desc_t>
          (TrimCapabilitiesPass *this,spv_operand_desc_t *descriptor,ExtensionSet *output)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = descriptor->minVersion;
  uVar2 = spvVersionForTargetEnv(((this->super_Pass).context_)->syntax_context_->target_env);
  if (uVar2 < uVar1) {
    EnumSet<spvtools::Extension>::insert<spvtools::Extension_const*>
              (output,descriptor->extensions,descriptor->extensions + descriptor->numExtensions);
    return;
  }
  return;
}

Assistant:

inline void addSupportedExtensionsToSet(const Descriptor* const descriptor,
                                          ExtensionSet* output) const {
    if (descriptor->minVersion <=
        spvVersionForTargetEnv(context()->GetTargetEnv())) {
      return;
    }
    output->insert(descriptor->extensions,
                   descriptor->extensions + descriptor->numExtensions);
  }